

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  WaitScope *waitScope;
  WirePointer *pWVar1;
  Event **ppEVar2;
  Disposer *pDVar3;
  PromiseNode *pPVar4;
  _Base_ptr p_Var5;
  ClientHook *pCVar6;
  PromiseFulfiller<void> *pPVar7;
  undefined8 uVar8;
  TransformPromiseNodeBase *pTVar9;
  socklen_t in_ECX;
  PromiseNode *pPVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  int in_R8D;
  Disposer *disposerCopy;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar11;
  Own<capnp::ClientHook> OVar12;
  bool returned;
  bool destroyed;
  Promise<void> destructionPromise;
  PromiseFulfillerPair<void> paf;
  Client client;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  TestContext context;
  char local_362;
  char local_361;
  undefined1 local_360 [8];
  TransformPromiseNodeBase *pTStack_358;
  Event *local_350;
  WirePointer *local_348;
  Event **local_340;
  Disposer *pDStack_338;
  TaskSet *local_330;
  Own<kj::_::PromiseNode> local_328;
  Own<kj::_::PromiseNode> local_318;
  _Base_ptr local_308;
  Own<capnp::ClientHook> local_300;
  Own<kj::_::PromiseNode> local_2f0;
  Own<kj::PromiseFulfiller<void>_> local_2e0;
  pointer_____offset_0x10___ *local_2d0;
  uint local_2c8;
  undefined4 uStack_2c4;
  PromiseNode *pPStack_2c0;
  ExceptionOrValue local_2b8;
  char local_158;
  Maybe<capnp::MessageSize> local_150;
  TestContext local_138;
  
  TestContext::TestContext(&local_138);
  kj::newPromiseAndFulfiller<void>();
  local_361 = '\0';
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,&local_2f0,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:653:46),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006316c0;
  pTVar9[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_361;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  OVar11 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_2b8,(Own<kj::_::PromiseNode> *)local_360);
  pTVar9 = pTStack_358;
  local_318.disposer._0_4_ = local_2b8.exception.ptr._0_4_;
  local_318.disposer._4_4_ = local_2b8.exception.ptr._4_4_;
  local_318.ptr = (PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode,OVar11.ptr);
  }
  TestContext::connect((TestContext *)local_360,(int)&local_138,(sockaddr *)0x5,in_ECX);
  (*(pTStack_358->super_PromiseNode)._vptr_PromiseNode[4])(&local_2b8);
  pTVar9 = pTStack_358;
  local_2c8 = local_2b8.exception.ptr._0_4_;
  uStack_2c4 = local_2b8.exception.ptr._4_4_;
  pPStack_2c0 = (PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  local_2d0 = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  local_362 = '\0';
  local_150.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)&local_2b8,(Client *)&local_2d0,&local_150);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>
            ((kj *)&local_328,&local_2e0);
  pPVar10 = local_328.ptr;
  local_360 = (undefined1  [8])local_328.disposer;
  pTStack_358 = (TransformPromiseNodeBase *)(local_328.ptr + 8);
  if (local_328.ptr == (PromiseNode *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
  }
  local_328.ptr = (PromiseNode *)0x0;
  OVar12 = Capability::Client::makeLocalClient
                     ((Client *)&local_300,(Own<capnp::Capability::Server> *)local_360);
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)(*(EventPort **)local_360)->_vptr_EventPort)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] + (long)&pTVar9->super_PromiseNode,
               OVar12.ptr);
  }
  local_308 = (_Base_ptr)&Capability::Client::typeinfo;
  local_360 = (undefined1  [8])CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
  ;
  pTStack_358 = (TransformPromiseNodeBase *)
                local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  local_350 = (Event *)local_2b8.exception.ptr.field_1.value.ownFile.content.disposer;
  PointerBuilder::setCapability((PointerBuilder *)local_360,&local_300);
  pCVar6 = local_300.ptr;
  __buf = extraout_RDX;
  if ((_Base_ptr)local_300.ptr != (_Base_ptr)0x0) {
    local_300.ptr = (ClientHook *)0x0;
    (*(code *)*(local_300.disposer)->_vptr_Disposer)
              (local_300.disposer,
               *(long *)(*(long *)pCVar6 + -0x10) + (long)&pCVar6->_vptr_ClientHook);
    __buf = extraout_RDX_00;
  }
  pPVar4 = local_328.ptr;
  if (local_328.ptr != (PromiseNode *)0x0) {
    local_328.ptr = (PromiseNode *)0x0;
    (*(code *)((EventPort *)(local_328.disposer)->_vptr_Disposer)->_vptr_EventPort)
              (local_328.disposer,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode);
    __buf = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_360,(int)&local_2b8,__buf,(size_t)pPVar10,in_R8D);
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)local_360,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:665:9),_kj::_::PropagateException>
             ::anon_class_8_1_d59fe34d_for_func::operator());
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00631748;
  pTVar9[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_362;
  local_328.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase646::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_328.ptr = (PromiseNode *)pTVar9;
  OVar11 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_308,&local_328);
  p_Var5 = local_308;
  pPVar10 = local_328.ptr;
  if ((TransformPromiseNodeBase *)local_328.ptr != (TransformPromiseNodeBase *)0x0) {
    local_328.ptr = (PromiseNode *)0x0;
    (*(code *)((EventPort *)(local_328.disposer)->_vptr_Disposer)->_vptr_EventPort)
              (local_328.disposer,
               ((PromiseNode *)&pPVar10->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar10->_vptr_PromiseNode)->_vptr_PromiseNode,OVar11.ptr);
  }
  pDVar3 = pDStack_338;
  ppEVar2 = local_340;
  if (local_340 != (Event **)0x0) {
    local_340 = (Event **)0x0;
    pDStack_338 = (Disposer *)0x0;
    (*(code *)local_330->errorHandler->_vptr_ErrorHandler)(local_330,ppEVar2,8,pDVar3,pDVar3,0);
  }
  pWVar1 = local_348;
  if (local_348 != (WirePointer *)0x0) {
    local_348 = (WirePointer *)0x0;
    (**local_350->_vptr_Event)
              (local_350,
               (long)&(pWVar1->offsetAndKind).value + (long)*(Event ***)((long)*pWVar1 + -0x10));
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] + (long)&pTVar9->super_PromiseNode)
    ;
  }
  uVar8 = local_2b8.exception.ptr.field_1.value.description.content.ptr;
  if ((_func_int **)local_2b8.exception.ptr.field_1.value.description.content.ptr !=
      (_func_int **)0x0) {
    local_2b8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_2b8.exception.ptr.field_1._32_8_)
              (local_2b8.exception.ptr.field_1._32_8_,
               (char *)(uVar8 + *(long *)(*(_func_int **)uVar8 + -0x10)));
  }
  kj::_::yield();
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:669:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006317d0;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_2,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  if ((PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  waitScope = &local_138.waitScope;
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_360,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:670:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00631858;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_3,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  if ((PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_360,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:671:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006318e0;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_4,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  if ((PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_360,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:672:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00631968;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_5,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  if ((PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_360,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:673:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006319f0;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_6,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  if ((PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_360,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  kj::_::yield();
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)&local_2b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:674:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00631a78;
  local_360 = (undefined1  [8])
              &kj::_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_7,kj::_::PropagateException>>
               ::instance;
  pTStack_358 = pTVar9;
  if ((PromiseNode *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_2b8.exception.ptr._4_4_,local_2b8.exception.ptr._0_4_),
      (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_360,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  pTVar9 = pTStack_358;
  if (pTStack_358 != (TransformPromiseNodeBase *)0x0) {
    pTStack_358 = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_360)->arena->_vptr_Arena)
              (local_360,
               (pTVar9->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode);
  }
  if ((local_361 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2a5,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  if ((local_362 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2a6,ERROR,"\"failed: expected \" \"!(returned)\"",
               (char (*) [29])"failed: expected !(returned)");
  }
  if ((_Base_ptr)local_300.disposer != (_Base_ptr)0x0) {
    (**(code **)*(pointer_____offset_0x10___ *)p_Var5)
              (p_Var5,*(long *)(*(long *)local_300.disposer + -0x10) +
                      (long)&(local_300.disposer)->_vptr_Disposer);
  }
  local_2b8.exception.ptr._0_4_ = local_2b8.exception.ptr._0_4_ & 0xffffff00;
  local_158 = '\0';
  kj::_::waitImpl(&local_318,&local_2b8,waitScope);
  if (local_158 == '\x01') {
    if ((kj)local_2b8.exception.ptr.isSet != (kj)0x0) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_2b8.exception.ptr.isSet == (kj)0x0) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if ((kj)local_2b8.exception.ptr.isSet == (kj)0x1) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  if ((local_361 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ab,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  if ((local_362 == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ac,ERROR,"\"failed: expected \" \"!(returned)\"",
               (char (*) [29])"failed: expected !(returned)");
  }
  pPVar10 = pPStack_2c0;
  if (pPStack_2c0 != (PromiseNode *)0x0) {
    pPStack_2c0 = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_2c4,local_2c8))
              ((undefined8 *)CONCAT44(uStack_2c4,local_2c8),
               pPVar10->_vptr_PromiseNode[-2] + (long)&pPVar10->_vptr_PromiseNode);
  }
  pPVar10 = local_318.ptr;
  if (local_318.ptr != (PromiseNode *)0x0) {
    local_318.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_318.disposer._4_4_,(uint)local_318.disposer))
              ((undefined8 *)CONCAT44(local_318.disposer._4_4_,(uint)local_318.disposer),
               pPVar10->_vptr_PromiseNode[-2] + (long)&pPVar10->_vptr_PromiseNode);
  }
  pPVar7 = local_2e0.ptr;
  if ((_Base_ptr)local_2e0.ptr != (_Base_ptr)0x0) {
    local_2e0.ptr = (PromiseFulfiller<void> *)0x0;
    (**(local_2e0.disposer)->_vptr_Disposer)
              (local_2e0.disposer,
               *(long *)(*(long *)pPVar7 + -0x10) + (long)&pPVar7->_vptr_PromiseFulfiller);
  }
  pPVar10 = local_2f0.ptr;
  if (local_2f0.ptr != (PromiseNode *)0x0) {
    local_2f0.ptr = (PromiseNode *)0x0;
    (**(local_2f0.disposer)->_vptr_Disposer)
              (local_2f0.disposer,pPVar10->_vptr_PromiseNode[-2] + (long)&pPVar10->_vptr_PromiseNode
              );
  }
  TestContext::~TestContext(&local_138);
  return;
}

Assistant:

TEST(Rpc, Cancelation) {
  // Tests allowCancellation().

  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(context.waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}